

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdjpeg.c
# Opt level: O2

FILE * write_stdout(void)

{
  return _stdout;
}

Assistant:

GLOBAL(FILE *)
write_stdout(void)
{
  FILE *output_file = stdout;

#ifdef USE_SETMODE              /* need to hack file mode? */
  setmode(fileno(stdout), O_BINARY);
#endif
#ifdef USE_FDOPEN               /* need to re-open in binary mode? */
  if ((output_file = fdopen(fileno(stdout), WRITE_BINARY)) == NULL) {
    fprintf(stderr, "Cannot reopen stdout\n");
    exit(EXIT_FAILURE);
  }
#endif
  return output_file;
}